

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCodeLoadIndexColumn(Parse *pParse,Index *pIdx,int iTabCur,int iIdxCol,int regOut)

{
  int in_ECX;
  int in_EDX;
  Parse *in_RSI;
  long in_RDI;
  int in_R8D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  i16 iTabCol;
  
  if (*(short *)(in_RSI->zErrMsg + (long)in_ECX * 2) == -2) {
    *(int *)(in_RDI + 0x44) = in_EDX + 1;
    sqlite3ExprCodeCopy(in_RSI,(Expr *)CONCAT44(in_EDX,in_ECX),in_R8D);
    *(undefined4 *)(in_RDI + 0x44) = 0;
  }
  else {
    sqlite3ExprCodeGetColumnOfTable
              ((Vdbe *)CONCAT44(iTabCur,iIdxCol),(Table *)CONCAT44(regOut,in_stack_00000008),
               unaff_retaddr_00,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeLoadIndexColumn(
  Parse *pParse,  /* The parsing context */
  Index *pIdx,    /* The index whose column is to be loaded */
  int iTabCur,    /* Cursor pointing to a table row */
  int iIdxCol,    /* The column of the index to be loaded */
  int regOut      /* Store the index column value in this register */
){
  i16 iTabCol = pIdx->aiColumn[iIdxCol];
  if( iTabCol==XN_EXPR ){
    assert( pIdx->aColExpr );
    assert( pIdx->aColExpr->nExpr>iIdxCol );
    pParse->iSelfTab = iTabCur + 1;
    sqlite3ExprCodeCopy(pParse, pIdx->aColExpr->a[iIdxCol].pExpr, regOut);
    pParse->iSelfTab = 0;
  }else{
    sqlite3ExprCodeGetColumnOfTable(pParse->pVdbe, pIdx->pTable, iTabCur,
                                    iTabCol, regOut);
  }
}